

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshio.cpp
# Opt level: O3

vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
* geometrycentral::surface::anon_unknown_19::paramToStdVector
            (vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
             *__return_storage_ptr__,SurfaceMesh *mesh,CornerData<Vector2> *param)

{
  vector<geometrycentral::Vector2,std::allocator<geometrycentral::Vector2>> *this;
  pointer *ppvVar1;
  pointer pvVar2;
  iterator __position;
  double dVar3;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *extraout_RAX;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *pvVar4;
  Vector2 *__args;
  size_t sVar5;
  long lVar6;
  pointer pvVar7;
  allocator_type local_51;
  size_t local_50;
  size_t local_48;
  long local_40;
  CornerData<Vector2> *local_38;
  
  local_38 = param;
  ::std::
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  ::vector(__return_storage_ptr__,mesh->nFacesCount,&local_51);
  local_48 = mesh->nFacesFillCount;
  pvVar4 = extraout_RAX;
  if ((local_48 == 0) ||
     (pvVar4 = (vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                *)(mesh->fHalfedgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
     (pvVar4->
     super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
     )._M_impl.super__Vector_impl_data._M_start != (pointer)0xffffffffffffffff)) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    do {
      if (local_48 - 1 == sVar5) {
        return pvVar4;
      }
      ppvVar1 = &(pvVar4->
                 super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + sVar5;
      sVar5 = sVar5 + 1;
    } while (*ppvVar1 == (pointer)0xffffffffffffffff);
  }
  if (sVar5 != local_48) {
    pvVar4 = (vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
              *)(mesh->fHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_50 = local_48 - 1;
    lVar6 = 0;
    do {
      pvVar2 = (&(pvVar4->
                 super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)[sVar5];
      pvVar7 = pvVar2;
      local_40 = lVar6;
      do {
        this = (vector<geometrycentral::Vector2,std::allocator<geometrycentral::Vector2>> *)
               ((__return_storage_ptr__->
                super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar6);
        __args = (local_38->data).
                 super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data + (long)pvVar7;
        __position._M_current = *(Vector2 **)(this + 8);
        if (__position._M_current == *(Vector2 **)(this + 0x10)) {
          ::std::vector<geometrycentral::Vector2,std::allocator<geometrycentral::Vector2>>::
          _M_realloc_insert<geometrycentral::Vector2_const&>(this,__position,__args);
        }
        else {
          dVar3 = __args->y;
          (__position._M_current)->x = __args->x;
          (__position._M_current)->y = dVar3;
          *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
        }
        pvVar7 = (pointer)(mesh->heNextArr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)pvVar7];
      } while (pvVar7 != pvVar2);
      pvVar4 = (vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                *)(mesh->fHalfedgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
      lVar6 = local_40 + 1;
      do {
        if (local_50 == sVar5) {
          return pvVar4;
        }
        ppvVar1 = &(pvVar4->
                   super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + sVar5;
        sVar5 = sVar5 + 1;
      } while (*ppvVar1 == (pointer)0xffffffffffffffff);
    } while (local_48 != sVar5);
  }
  return pvVar4;
}

Assistant:

std::vector<std::vector<Vector2>> paramToStdVector(SurfaceMesh& mesh, CornerData<Vector2>& param) {
  std::vector<std::vector<Vector2>> uv(mesh.nFaces());
  size_t i = 0;
  for (Face f : mesh.faces()) {
    for (Corner c : f.adjacentCorners()) {
      uv[i].push_back(param[c]);
    }
    i++;
  }
  return uv;
}